

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::MessageBuilder::MessageBuilder
          (MessageBuilder *this,char *file,int line,Enum severity)

{
  ostream *poVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  
  MessageData::MessageData((MessageData *)0x10ba54);
  *(undefined1 *)(in_RDI + 0x30) = 0;
  poVar1 = tlssPush();
  *(ostream **)(in_RDI + 0x28) = poVar1;
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  *(undefined4 *)(in_RDI + 0x20) = in_EDX;
  *(undefined4 *)(in_RDI + 0x24) = in_ECX;
  return;
}

Assistant:

MessageBuilder::MessageBuilder(const char* file, int line, assertType::Enum severity) {
        m_stream   = tlssPush();
        m_file     = file;
        m_line     = line;
        m_severity = severity;
    }